

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

bool __thiscall
absl::lts_20240722::flags_internal::FlagImpl::RestoreState(FlagImpl *this,FlagState *flag_state)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  
  DataGuard(this);
  absl::lts_20240722::Mutex::Lock();
  lVar1 = flag_state->counter_;
  uVar2 = (this->seq_lock_).lock_.super___atomic_base<long>._M_i;
  if ((uVar2 & 1) == 0) {
    lVar4 = (long)uVar2 >> 1;
    if (lVar1 != lVar4) {
      if ((this->field_0x28 & 4) == 0) {
        StoreValue(this,&flag_state->value_,kProgrammaticChange);
      }
      else {
        StoreValue(this,(flag_state->value_).heap_allocated,kProgrammaticChange);
      }
      bVar3 = this->field_0x29 & 0xfb | flag_state->modified_ << 2;
      this->field_0x29 = bVar3;
      this->field_0x29 = bVar3 & 0xf7 | flag_state->on_command_line_ << 3;
    }
    absl::lts_20240722::Mutex::Unlock();
    return lVar1 != lVar4;
  }
  __assert_fail("val != kUninitialized && (val & 1) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/flags/internal/sequence_lock.h"
                ,0x7f,"int64_t absl::flags_internal::SequenceLock::ModificationCount() const");
}

Assistant:

bool FlagImpl::RestoreState(const FlagState& flag_state) {
  absl::MutexLock l(DataGuard());
  if (flag_state.counter_ == ModificationCount()) {
    return false;
  }

  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic:
      StoreValue(&flag_state.value_.one_word, kProgrammaticChange);
      break;
    case FlagValueStorageKind::kSequenceLocked:
    case FlagValueStorageKind::kHeapAllocated:
      StoreValue(flag_state.value_.heap_allocated, kProgrammaticChange);
      break;
  }

  modified_ = flag_state.modified_;
  on_command_line_ = flag_state.on_command_line_;

  return true;
}